

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void dynet::TensorTools::copy_elements(Tensor *v,Tensor *v_src)

{
  void *__dest;
  void *__src;
  uint uVar1;
  runtime_error *prVar2;
  long in_RSI;
  long in_RDI;
  Dim *in_stack_ffffffffffffffc0;
  
  if (*(int *)(*(long *)(in_RDI + 0x30) + 0xc) != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Bad device type");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(int *)(*(long *)(in_RSI + 0x30) + 0xc) == 0) {
    __dest = *(void **)(in_RDI + 0x28);
    __src = *(void **)(in_RSI + 0x28);
    uVar1 = Dim::size(in_stack_ffffffffffffffc0);
    memcpy(__dest,__src,(ulong)uVar1 << 2);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"Bad device type");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TensorTools::copy_elements(Tensor& v, const Tensor& v_src) {
  if (v.device->type == DeviceType::CPU) {
    if (v_src.device->type == DeviceType::CPU) {
      memcpy(v.v, v_src.v, sizeof(real) * v.d.size());
#if HAVE_CUDA
    } else if (v_src.device->type == DeviceType::GPU) {
      cudaMemcpyAsync(v.v, v_src.v, sizeof(real) * v.d.size(), cudaMemcpyDeviceToHost);
#endif
    } else { throw std::runtime_error("Bad device type"); }
#if HAVE_CUDA
  } else if (v.device->type == DeviceType::GPU) {
    if (v_src.device->type == DeviceType::CPU) {
      cudaMemcpyAsync(v.v, v_src.v, sizeof(real) * v.d.size(), cudaMemcpyHostToDevice);
    } else {
      cudaMemcpyAsync(v.v, v_src.v, sizeof(real) * v.d.size(), cudaMemcpyDeviceToDevice);
    }
#endif
  } else { throw std::runtime_error("Bad device type"); }
}